

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O2

sunindextype SUNDlsMat_denseGETRF(realtype **a,sunindextype m,sunindextype n,sunindextype *p)

{
  double dVar1;
  realtype rVar2;
  realtype *prVar3;
  realtype *prVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  
  uVar8 = 0;
  if (0 < n) {
    uVar8 = (ulong)(uint)n;
  }
  lVar11 = 0;
  lVar9 = 1;
  uVar14 = 0;
  while( true ) {
    if (uVar14 == uVar8) {
      return 0;
    }
    prVar3 = a[uVar14];
    lVar12 = 1;
    uVar7 = uVar14 & 0xffffffff;
    while( true ) {
      iVar5 = (int)uVar14;
      uVar6 = iVar5 + (int)lVar12;
      uVar10 = (uint)uVar7;
      if (m <= (int)uVar6) break;
      if (ABS(*(double *)((long)prVar3 + lVar12 * 8 + lVar11)) <= ABS(prVar3[(int)uVar10])) {
        uVar6 = uVar10;
      }
      lVar12 = lVar12 + 1;
      uVar7 = (ulong)uVar6;
    }
    p[uVar14] = uVar10;
    if ((prVar3[(int)uVar10] == 0.0) && (!NAN(prVar3[(int)uVar10]))) break;
    if (uVar14 != uVar7) {
      for (uVar7 = 0; (uint)n != uVar7; uVar7 = uVar7 + 1) {
        prVar4 = a[uVar7];
        rVar2 = prVar4[(int)uVar10];
        prVar4[(int)uVar10] = prVar4[uVar14];
        prVar4[uVar14] = rVar2;
      }
    }
    dVar1 = prVar3[uVar14];
    for (lVar12 = 1; lVar13 = lVar9, iVar5 + (int)lVar12 < m; lVar12 = lVar12 + 1) {
      *(double *)((long)prVar3 + lVar12 * 8 + lVar11) =
           *(double *)((long)prVar3 + lVar12 * 8 + lVar11) * (1.0 / dVar1);
    }
    for (; (int)lVar13 < n; lVar13 = lVar13 + 1) {
      prVar4 = a[lVar13];
      dVar1 = prVar4[uVar14];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        for (lVar12 = 1; iVar5 + (int)lVar12 < m; lVar12 = lVar12 + 1) {
          *(double *)((long)prVar4 + lVar12 * 8 + lVar11) =
               *(double *)((long)prVar3 + lVar12 * 8 + lVar11) * -dVar1 +
               *(double *)((long)prVar4 + lVar12 * 8 + lVar11);
        }
      }
    }
    lVar9 = lVar9 + 1;
    lVar11 = lVar11 + 8;
    uVar14 = uVar14 + 1;
  }
  return (sunindextype)(uVar14 + 1);
}

Assistant:

sunindextype SUNDlsMat_denseGETRF(realtype **a, sunindextype m, sunindextype n, sunindextype *p)
{
  sunindextype i, j, k, l;
  realtype *col_j, *col_k;
  realtype temp, mult, a_kj;

  /* k-th elimination step number */
  for (k=0; k < n; k++) {

    col_k  = a[k];

    /* find l = pivot row number */
    l=k;
    for (i=k+1; i < m; i++)
      if (SUNRabs(col_k[i]) > SUNRabs(col_k[l])) l=i;
    p[k] = l;

    /* check for zero pivot element */
    if (col_k[l] == ZERO) return(k+1);

    /* swap a(k,1:n) and a(l,1:n) if necessary */
    if ( l!= k ) {
      for (i=0; i<n; i++) {
        temp = a[i][l];
        a[i][l] = a[i][k];
        a[i][k] = temp;
      }
    }

    /* Scale the elements below the diagonal in
     * column k by 1.0/a(k,k). After the above swap
     * a(k,k) holds the pivot element. This scaling
     * stores the pivot row multipliers a(i,k)/a(k,k)
     * in a(i,k), i=k+1, ..., m-1.
     */
    mult = ONE/col_k[k];
    for(i=k+1; i < m; i++) col_k[i] *= mult;

    /* row_i = row_i - [a(i,k)/a(k,k)] row_k, i=k+1, ..., m-1 */
    /* row k is the pivot row after swapping with row l.      */
    /* The computation is done one column at a time,          */
    /* column j=k+1, ..., n-1.                                */

    for (j=k+1; j < n; j++) {

      col_j = a[j];
      a_kj = col_j[k];

      /* a(i,j) = a(i,j) - [a(i,k)/a(k,k)]*a(k,j)  */
      /* a_kj = a(k,j), col_k[i] = - a(i,k)/a(k,k) */

      if (a_kj != ZERO) {
        for (i=k+1; i < m; i++)
          col_j[i] -= a_kj * col_k[i];
      }
    }
  }

  /* return 0 to indicate success */

  return(0);
}